

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_functype_t::~wasm_functype_t(wasm_functype_t *this)

{
  wasm_functype_t *this_local;
  
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_functype_t_00392be8;
  wasm_valtype_vec_delete(&this->params);
  wasm_valtype_vec_delete(&this->results);
  wasm_externtype_t::~wasm_externtype_t(&this->super_wasm_externtype_t);
  return;
}

Assistant:

~wasm_functype_t() {
    wasm_valtype_vec_delete(&params);
    wasm_valtype_vec_delete(&results);
  }